

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

void leb__HeapWriteExplicit(leb_Heap *leb,leb_Node node,int32_t bitCount,uint32_t bitData)

{
  int iVar1;
  uint32_t *puVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar1 = leb->maxDepth;
  uVar6 = ((iVar1 - node.depth) + 1) * node.id + (2 << ((byte)node.depth & 0x1f));
  uVar4 = uVar6 & 0x1f;
  uVar5 = 0x20 - uVar4;
  if ((uint)bitCount <= 0x20 - uVar4) {
    uVar5 = bitCount;
  }
  if (uVar5 + uVar4 < 0x21) {
    uVar6 = uVar6 >> 5;
    puVar2 = leb->buffer;
    puVar2[uVar6] =
         bitData << (sbyte)uVar4 | ~(~(-1 << ((byte)uVar5 & 0x1f)) << (sbyte)uVar4) & puVar2[uVar6];
    if (bitCount - uVar5 < 0x21) {
      uVar4 = ((uint)(1 << ((char)iVar1 + 2U & 0x1f)) >> 5) - 1;
      if (uVar6 + 1 < uVar4) {
        uVar4 = uVar6 + 1;
      }
      bVar3 = (byte)(bitCount - uVar5);
      puVar2[uVar4] =
           (puVar2[uVar4] >> (bVar3 & 0x1f)) << (bVar3 & 0x1f) | bitData >> ((byte)uVar5 & 0x1f);
      return;
    }
  }
  __assert_fail("bitOffset < 32u && bitCount <= 32u && bitOffset + bitCount <= 32u",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0xb4,"void leb__BitFieldInsert(uint32_t *, uint32_t, uint32_t, uint32_t)");
}

Assistant:

static void
leb__HeapWriteExplicit(
    leb_Heap *leb,
    const leb_Node node,
    int32_t bitCount,
    uint32_t bitData
) {
    leb__HeapArgs args = leb__CreateHeapArgs(leb, node, bitCount);

    leb__BitFieldInsert(args.bitFieldLSB,
                        args.bitOffsetLSB,
                        args.bitCountLSB,
                        bitData);
    leb__BitFieldInsert(args.bitFieldMSB,
                        0u,
                        args.bitCountMSB,
                        bitData >> args.bitCountLSB);
}